

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::CloseFile(BamMultiReaderPrivate *this,string *filename)

{
  undefined1 uVar1;
  size_type in_RSI;
  value_type *in_RDI;
  string message;
  string currentError;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [8];
  string *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  BamMultiReaderPrivate *in_stack_ffffffffffffff30;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  BamMultiReaderPrivate *in_stack_ffffffffffffffa0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_31;
  size_type local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::__cxx11::string::clear();
  this_00 = &local_31;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x19701c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00,local_18,in_RDI,
           (allocator_type *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x197047);
  uVar1 = CloseFiles(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((bool)uVar1) {
    local_1 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&stack0xffffffffffffff98,(string *)(in_RDI + 1));
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"error while closing file: ",(allocator *)__rhs);
    std::operator+((RuleToken *)CONCAT17(uVar1,in_stack_fffffffffffffec8),__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_fffffffffffffec8),(char)((ulong)__rhs >> 0x38));
    std::operator+((RuleToken *)CONCAT17(uVar1,in_stack_fffffffffffffec8),__rhs);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"BamMultiReader::CloseFile",&local_111);
    SetErrorString(in_stack_ffffffffffffff30,(string *)in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    local_1 = 0;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDI);
  return (bool)(local_1 & 1);
}

Assistant:

bool BamMultiReaderPrivate::CloseFile(const std::string& filename)
{

    m_errorString.clear();

    std::vector<std::string> filenames(1, filename);
    if (CloseFiles(filenames)) {
        return true;
    } else {
        const std::string currentError = m_errorString;
        const std::string message =
            std::string("error while closing file: ") + filename + '\n' + currentError;
        SetErrorString("BamMultiReader::CloseFile", message);
        return false;
    }
}